

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O3

void __thiscall mocker::Annotator::checkVarDecl(Annotator *this,VarDeclStmt *node)

{
  bool bVar1;
  int iVar2;
  mapped_type *rhs;
  CompileError *this_00;
  mapped_type *pmVar3;
  pointer_____offset_0x10___ *ppuVar4;
  shared_ptr<mocker::ast::ASTNode> local_28;
  
  iVar2 = std::__cxx11::string::compare
                    ((char *)&((node->identifier).
                               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->val);
  if (iVar2 == 0) {
    this_00 = (CompileError *)__cxa_allocate_exception(0x48);
    local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)node;
    pmVar3 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(this->pos,(key_type *)&local_28);
    CompileError::CompileError(this_00,pmVar3->first,pmVar3->second);
    ppuVar4 = &CompileError::typeinfo;
LAB_001900b9:
    __cxa_throw(this_00,ppuVar4,CompileError::~CompileError);
  }
  local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((node->type).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ASTNode;
  local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->type).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  visit(this,&local_28);
  if (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ASTNode;
  if (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    visit(this,&local_28);
    if (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((node->initExpr).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->super_ASTNode;
    rhs = std::__detail::
          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this->ctx->exprType,(key_type *)&local_28);
    bVar1 = assignable(this,&node->type,rhs);
    if (!bVar1) {
      this_00 = (CompileError *)__cxa_allocate_exception(0x48);
      local_28.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)node;
      pmVar3 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::at(this->pos,(key_type *)&local_28);
      CompileError::CompileError(this_00,pmVar3->first,pmVar3->second);
      *(undefined ***)this_00 = &PTR__CompileError_001ec9f8;
      ppuVar4 = &IncompatibleTypes::typeinfo;
      goto LAB_001900b9;
    }
  }
  return;
}

Assistant:

void checkVarDecl(const ast::VarDeclStmt &node) const {
    if (node.identifier->val == "this")
      throw CompileError(pos.at(node.getID()));
    visit(node.type);
    if (!node.initExpr)
      return;
    visit(node.initExpr);
    if (!assignable(node.type, ctx.exprType[node.initExpr->getID()]))
      throw IncompatibleTypes(pos.at(node.getID()));
  }